

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

Id dxil_spv::build_constant_expression(Impl *impl,ConstantExpr *cexpr)

{
  undefined8 uVar1;
  uint uVar2;
  void *pvVar3;
  char local_1028 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  ConstantExpr *cexpr_local;
  Impl *impl_local;
  
  uVar2 = LLVMBC::ConstantExpr::getOpcode(cexpr);
  if (uVar2 - 0x65 < 0xd) {
    impl_local._4_4_ = build_constant_cast(impl,cexpr);
  }
  else if (uVar2 == 200) {
    impl_local._4_4_ = build_constant_getelementptr(impl,cexpr);
  }
  else if (uVar2 - 0x12d < 0x12) {
    impl_local._4_4_ = emit_binary_instruction_impl<LLVMBC::ConstantExpr>(impl,cexpr);
  }
  else {
    buffer._4088_8_ = get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Unknown constant-expr.\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_1028,0x1000,"Unknown constant-expr.\n");
      uVar1 = buffer._4088_8_;
      pvVar3 = get_thread_log_callback_userdata();
      (*(code *)uVar1)(pvVar3,2,local_1028);
    }
    impl_local._4_4_ = 0;
  }
  return impl_local._4_4_;
}

Assistant:

spv::Id build_constant_expression(Converter::Impl &impl, const llvm::ConstantExpr *cexpr)
{
	switch (cexpr->getOpcode())
	{
	case llvm::Instruction::GetElementPtr:
		return build_constant_getelementptr(impl, cexpr);

	case llvm::Instruction::Trunc:
	case llvm::Instruction::ZExt:
	case llvm::Instruction::SExt:
	case llvm::Instruction::FPToUI:
	case llvm::Instruction::FPToSI:
	case llvm::Instruction::UIToFP:
	case llvm::Instruction::SIToFP:
	case llvm::Instruction::FPTrunc:
	case llvm::Instruction::FPExt:
	case llvm::Instruction::PtrToInt:
	case llvm::Instruction::IntToPtr:
	case llvm::Instruction::BitCast:
	case llvm::Instruction::AddrSpaceCast:
		return build_constant_cast(impl, cexpr);

	case llvm::Instruction::Add:
	case llvm::Instruction::FAdd:
	case llvm::Instruction::Sub:
	case llvm::Instruction::FSub:
	case llvm::Instruction::Mul:
	case llvm::Instruction::FMul:
	case llvm::Instruction::UDiv:
	case llvm::Instruction::SDiv:
	case llvm::Instruction::FDiv:
	case llvm::Instruction::URem:
	case llvm::Instruction::SRem:
	case llvm::Instruction::FRem:
	case llvm::Instruction::Shl:
	case llvm::Instruction::LShr:
	case llvm::Instruction::AShr:
	case llvm::Instruction::And:
	case llvm::Instruction::Or:
	case llvm::Instruction::Xor:
		return emit_binary_instruction_impl(impl, cexpr);

	default:
	{
		LOGE("Unknown constant-expr.\n");
		break;
	}
	}

	return 0;
}